

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

int fullpacket(LIBSSH2_SESSION *session,int encrypted)

{
  uint32_t seq_00;
  int iVar1;
  int iVar2;
  size_t __n;
  bool bVar3;
  size_t local_e0;
  size_t data_len;
  uchar *data;
  uchar *puStack_c8;
  int blocksize;
  uchar *decrypt_buffer;
  ssize_t decrypt_size;
  uchar first_block [32];
  size_t mac_len;
  int etm;
  uint32_t seq;
  LIBSSH2_MAC_METHOD *remote_mac;
  int compressed;
  int rc;
  transportpacket *p;
  uchar macbuf [64];
  int encrypted_local;
  LIBSSH2_SESSION *session_local;
  
  _etm = (_LIBSSH2_MAC_METHOD *)0x0;
  seq_00 = (session->remote).seqno;
  if ((encrypted == 0) ||
     ((((session->remote).crypt == (LIBSSH2_CRYPT_METHOD *)0x0 ||
       ((((session->remote).crypt)->flags & 4U) == 0)) &&
      (((session->remote).crypt == (LIBSSH2_CRYPT_METHOD *)0x0 ||
       ((((session->remote).crypt)->flags & 1U) == 0)))))) {
    _etm = (session->remote).mac;
  }
  if (session->fullpacket_state == libssh2_NB_state_idle) {
    session->fullpacket_macstate = 0;
    session->fullpacket_payload_len = (ulong)((session->packet).packet_length - 1);
    if ((encrypted == 0) || (_etm == (_LIBSSH2_MAC_METHOD *)0x0)) {
      if ((encrypted != 0) &&
         (((session->remote).crypt != (LIBSSH2_CRYPT_METHOD *)0x0 &&
          ((((session->remote).crypt)->flags & 4U) != 0)))) {
        memmove((session->packet).payload,(session->packet).payload + 1,
                (ulong)((session->packet).packet_length - 1));
      }
    }
    else {
      iVar2 = _etm->etm;
      __n = (size_t)_etm->mac_len;
      if (iVar2 == 0) {
        (*_etm->hash)(session,(uchar *)&p,(session->remote).seqno,(session->packet).init,5,
                      (session->packet).payload,session->fullpacket_payload_len,
                      &(session->remote).mac_abstract);
      }
      else {
        (*_etm->hash)(session,(uchar *)&p,(session->remote).seqno,(session->packet).payload,
                      (session->packet).total_num - __n,(uchar *)0x0,0,
                      &(session->remote).mac_abstract);
      }
      iVar1 = memcmp(&p,(session->packet).payload + ((session->packet).total_num - __n),__n);
      if (iVar1 == 0) {
        if (iVar2 != 0) {
          data._4_4_ = ((session->remote).crypt)->blocksize;
          decrypt_size._0_1_ = '\0';
          iVar2 = decrypt((EVP_PKEY_CTX *)session,(session->packet).payload + 4,
                          (size_t *)&decrypt_size,(uchar *)(long)data._4_4_,1);
          if (iVar2 != 0) {
            return iVar2;
          }
          decrypt_buffer = (uchar *)(((session->packet).total_num - __n) - 4);
          puStack_c8 = (uchar *)(*session->alloc)((size_t)decrypt_buffer,&session->abstract);
          if (puStack_c8 == (uchar *)0x0) {
            return -6;
          }
          (session->packet).padding_length = (uint8_t)decrypt_size;
          if (1 < data._4_4_) {
            memcpy(puStack_c8,(void *)((long)&decrypt_size + 1),(long)(data._4_4_ + -1));
          }
          if (((long)data._4_4_ < (long)decrypt_buffer) &&
             (iVar2 = decrypt((EVP_PKEY_CTX *)session,
                              (session->packet).payload + (long)data._4_4_ + 4,
                              (size_t *)(puStack_c8 + (long)data._4_4_ + -1),
                              decrypt_buffer + -(long)data._4_4_,2), iVar2 != 0)) {
            (*session->free)(puStack_c8,&session->abstract);
            return iVar2;
          }
          (*session->free)((session->packet).payload,&session->abstract);
          (session->packet).payload = puStack_c8;
        }
      }
      else {
        session->fullpacket_macstate = -1;
      }
    }
    (session->remote).seqno = (session->remote).seqno + 1;
    session->fullpacket_payload_len =
         session->fullpacket_payload_len - (ulong)(session->packet).padding_length;
    bVar3 = false;
    if ((((session->local).comp != (LIBSSH2_COMP_METHOD *)0x0) &&
        (bVar3 = false, ((session->local).comp)->compress != 0)) &&
       (bVar3 = true, (session->state & 8U) == 0)) {
      bVar3 = ((session->local).comp)->use_in_auth != 0;
    }
    if ((bVar3) && ((session->remote).comp_abstract != (void *)0x0)) {
      iVar2 = (*((session->remote).comp)->decomp)
                        (session,(uchar **)&data_len,&local_e0,40000,(session->packet).payload,
                         session->fullpacket_payload_len,&(session->remote).comp_abstract);
      (*session->free)((session->packet).payload,&session->abstract);
      if (iVar2 != 0) {
        return iVar2;
      }
      (session->packet).payload = (uchar *)data_len;
      session->fullpacket_payload_len = local_e0;
    }
    session->fullpacket_packet_type = (uint)*(session->packet).payload;
    session->fullpacket_state = libssh2_NB_state_created;
  }
  if (session->fullpacket_state == libssh2_NB_state_created) {
    iVar2 = _libssh2_packet_add(session,(session->packet).payload,session->fullpacket_payload_len,
                                session->fullpacket_macstate,seq_00);
    if (iVar2 == -0x25) {
      return -0x25;
    }
    if (iVar2 != 0) {
      session->fullpacket_state = libssh2_NB_state_idle;
      return iVar2;
    }
  }
  session->fullpacket_state = libssh2_NB_state_idle;
  if ((session->kex_strict != 0) && (session->fullpacket_packet_type == 0x15)) {
    (session->remote).seqno = 0;
  }
  return session->fullpacket_packet_type;
}

Assistant:

static int
fullpacket(LIBSSH2_SESSION * session, int encrypted /* 1 or 0 */ )
{
    unsigned char macbuf[MAX_MACSIZE];
    struct transportpacket *p = &session->packet;
    int rc;
    int compressed;
    const LIBSSH2_MAC_METHOD *remote_mac = NULL;
    uint32_t seq = session->remote.seqno;

    if(!encrypted || (!CRYPT_FLAG_R(session, REQUIRES_FULL_PACKET) &&
                      !CRYPT_FLAG_R(session, INTEGRATED_MAC))) {
        remote_mac = session->remote.mac;
    }

    if(session->fullpacket_state == libssh2_NB_state_idle) {
        session->fullpacket_macstate = LIBSSH2_MAC_CONFIRMED;
        session->fullpacket_payload_len = p->packet_length - 1;

        if(encrypted && remote_mac) {

            /* Calculate MAC hash */
            int etm = remote_mac->etm;
            size_t mac_len = remote_mac->mac_len;
            if(etm) {
                /* store hash here */
                remote_mac->hash(session, macbuf,
                                 session->remote.seqno,
                                 p->payload, p->total_num - mac_len,
                                 NULL, 0,
                                 &session->remote.mac_abstract);
            }
            else {
                /* store hash here */
                remote_mac->hash(session, macbuf,
                                 session->remote.seqno,
                                 p->init, 5,
                                 p->payload,
                                 session->fullpacket_payload_len,
                                 &session->remote.mac_abstract);
            }

            /* Compare the calculated hash with the MAC we just read from
             * the network. The read one is at the very end of the payload
             * buffer. Note that 'payload_len' here is the packet_length
             * field which includes the padding but not the MAC.
             */
            if(memcmp(macbuf, p->payload + p->total_num - mac_len, mac_len)) {
                _libssh2_debug((session, LIBSSH2_TRACE_SOCKET,
                               "Failed MAC check"));
                session->fullpacket_macstate = LIBSSH2_MAC_INVALID;

            }
            else if(etm) {
                /* MAC was ok and we start by decrypting the first block that
                   contains padding length since this allows us to decrypt
                   all other blocks to the right location in memory
                   avoiding moving a larger block of memory one byte. */
                unsigned char first_block[MAX_BLOCKSIZE];
                ssize_t decrypt_size;
                unsigned char *decrypt_buffer;
                int blocksize = session->remote.crypt->blocksize;

                first_block[0] = 0;

                rc = decrypt(session, p->payload + 4,
                             first_block, blocksize, FIRST_BLOCK);
                if(rc) {
                    return rc;
                }

                /* we need buffer for decrypt */
                decrypt_size = p->total_num - mac_len - 4;
                decrypt_buffer = LIBSSH2_ALLOC(session, decrypt_size);
                if(!decrypt_buffer) {
                    return LIBSSH2_ERROR_ALLOC;
                }

                /* grab padding length and copy anything else
                   into target buffer */
                p->padding_length = first_block[0];
                if(blocksize > 1) {
                    memcpy(decrypt_buffer, first_block + 1, blocksize - 1);
                }

                /* decrypt all other blocks packet */
                if(blocksize < decrypt_size) {
                    rc = decrypt(session, p->payload + blocksize + 4,
                                 decrypt_buffer + blocksize - 1,
                                 decrypt_size - blocksize, LAST_BLOCK);
                    if(rc) {
                        LIBSSH2_FREE(session, decrypt_buffer);
                        return rc;
                    }
                }

                /* replace encrypted payload with plain text payload */
                LIBSSH2_FREE(session, p->payload);
                p->payload = decrypt_buffer;
            }
        }
        else if(encrypted && CRYPT_FLAG_R(session, REQUIRES_FULL_PACKET)) {
            /* etm trim off padding byte from payload */
            memmove(p->payload, &p->payload[1], p->packet_length - 1);
        }

        session->remote.seqno++;

        /* ignore the padding */
        session->fullpacket_payload_len -= p->padding_length;

        /* Check for and deal with decompression */
        compressed = session->local.comp &&
                     session->local.comp->compress &&
                     ((session->state & LIBSSH2_STATE_AUTHENTICATED) ||
                      session->local.comp->use_in_auth);

        if(compressed && session->remote.comp_abstract) {
            /*
             * The buffer for the decompression (remote.comp_abstract) is
             * initialised in time when it is needed so as long it is NULL we
             * cannot decompress.
             */

            unsigned char *data;
            size_t data_len;
            rc = session->remote.comp->decomp(session,
                                              &data, &data_len,
                                              LIBSSH2_PACKET_MAXDECOMP,
                                              p->payload,
                                              session->fullpacket_payload_len,
                                              &session->remote.comp_abstract);
            LIBSSH2_FREE(session, p->payload);
            if(rc)
                return rc;

            p->payload = data;
            session->fullpacket_payload_len = data_len;
        }

        session->fullpacket_packet_type = p->payload[0];

        debugdump(session, "libssh2_transport_read() plain",
                  p->payload, session->fullpacket_payload_len);

        session->fullpacket_state = libssh2_NB_state_created;
    }

    if(session->fullpacket_state == libssh2_NB_state_created) {
        rc = _libssh2_packet_add(session, p->payload,
                                 session->fullpacket_payload_len,
                                 session->fullpacket_macstate, seq);
        if(rc == LIBSSH2_ERROR_EAGAIN)
            return rc;
        if(rc) {
            session->fullpacket_state = libssh2_NB_state_idle;
            return rc;
        }
    }

    session->fullpacket_state = libssh2_NB_state_idle;

    if(session->kex_strict &&
        session->fullpacket_packet_type == SSH_MSG_NEWKEYS) {
        session->remote.seqno = 0;
    }

    return session->fullpacket_packet_type;
}